

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoginState.cpp
# Opt level: O1

int __thiscall LoginState::init(LoginState *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int connection_id;
  uint local_25c;
  shared_ptr<Connection> local_258;
  undefined8 local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  string local_238;
  Connection local_218;
  
  local_248 = *(undefined8 *)ctx;
  local_240 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ctx + 8);
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_240->_M_use_count = local_240->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_240->_M_use_count = local_240->_M_use_count + 1;
    }
  }
  GameState::init(&this->super_GameState,(EVP_PKEY_CTX *)&local_248);
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"Welcome to SkelMUD!\r\nPlease enter your m_username\r\n","");
  local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)ctx;
  local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ctx + 8);
  if (local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Sender::Send(&local_238,&local_258);
  if (local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  Connection::Connection(&local_218,*(Connection **)ctx);
  GameState::CleanPrompt(&this->super_GameState,&local_218);
  Connection::~Connection(&local_218);
  local_25c = Connection::GetID(*(Connection **)ctx);
  pmVar2 = (mapped_type *)(ulong)local_25c;
  p_Var1 = &(this->m_state_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->m_state_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)local_25c]) {
    if ((int)local_25c <= (int)p_Var4[1]._M_color) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, (int)local_25c < (int)p_Var3[1]._M_color)) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_state_map,(key_type *)&local_25c);
    *pmVar2 = 0;
  }
  return (int)pmVar2;
}

Assistant:

void LoginState::init(std::shared_ptr<Connection> connection) {
    GameState::init(connection);
    Sender::Send("Welcome to SkelMUD!\r\nPlease enter your m_username\r\n", connection);
    CleanPrompt(*connection);
    //connection->SetPrompt(GetPrompt(*connection));
    int connection_id = connection->GetID();
    if(m_state_map.find(connection_id) == m_state_map.end())
        m_state_map[connection_id] = USERNAME;
}